

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O3

Vec_Int_t * Llb_Nonlin4CollectHighRefNodes(Aig_Man_t *pAig,int nFans)

{
  ulong *puVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  int *__ptr;
  uint uVar7;
  int iVar8;
  Vec_Ptr_t *pVVar9;
  
  Aig_ManCleanMarkA(pAig);
  pVVar9 = pAig->vObjs;
  if (0 < pVVar9->nSize) {
    lVar5 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar5];
      if (pvVar2 != (void *)0x0) {
        uVar3 = *(ulong *)((long)pvVar2 + 0x18);
        if ((nFans <= (int)((uint)(uVar3 >> 6) & 0x3ffffff)) && (0xfffffffd < ((uint)uVar3 & 7) - 7)
           ) {
          *(ulong *)((long)pvVar2 + 0x18) = uVar3 | 0x10;
          pVVar9 = pAig->vObjs;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar9->nSize);
  }
  if (0 < pAig->nRegs) {
    iVar4 = 0;
    do {
      uVar7 = pAig->nTruePos + iVar4;
      if (((int)uVar7 < 0) || (pAig->vCos->nSize <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (ulong *)((*(ulong *)((long)pAig->vCos->pArray[uVar7] + 8) & 0xfffffffffffffffe) +
                        0x18);
      *puVar1 = *puVar1 & 0xffffffffffffffef;
      iVar4 = iVar4 + 1;
    } while (iVar4 < pAig->nRegs);
    pVVar9 = pAig->vObjs;
  }
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  __ptr = (int *)malloc(400);
  pVVar6->pArray = __ptr;
  if (0 < pVVar9->nSize) {
    lVar5 = 0;
    do {
      pvVar2 = pVVar9->pArray[lVar5];
      if (((pvVar2 != (void *)0x0) && ((*(ulong *)((long)pvVar2 + 0x18) & 0x10) != 0)) &&
         (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7)) {
        iVar4 = *(int *)((long)pvVar2 + 0x24);
        uVar7 = pVVar6->nSize;
        if (uVar7 == pVVar6->nCap) {
          if ((int)uVar7 < 0x10) {
            if (__ptr == (int *)0x0) {
              __ptr = (int *)malloc(0x40);
            }
            else {
              __ptr = (int *)realloc(__ptr,0x40);
            }
            pVVar6->pArray = __ptr;
            iVar8 = 0x10;
            if (__ptr == (int *)0x0) {
LAB_00834b65:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
          }
          else {
            if (__ptr == (int *)0x0) {
              __ptr = (int *)malloc((ulong)uVar7 * 8);
            }
            else {
              __ptr = (int *)realloc(__ptr,(ulong)uVar7 * 8);
            }
            pVVar6->pArray = __ptr;
            if (__ptr == (int *)0x0) goto LAB_00834b65;
            iVar8 = uVar7 * 2;
          }
          pVVar6->nCap = iVar8;
        }
        pVVar6->nSize = uVar7 + 1;
        __ptr[(int)uVar7] = iVar4;
        pVVar9 = pAig->vObjs;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar9->nSize);
  }
  Aig_ManCleanMarkA(pAig);
  return pVVar6;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CollectHighRefNodes( Aig_Man_t * pAig, int nFans )
{
    Vec_Int_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanMarkA( pAig );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Aig_ObjRefs(pObj) >= nFans )
            pObj->fMarkA = 1;
    // unmark flop drivers
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjFanin0(pObj)->fMarkA = 0;
    // collect mapping
    vNodes = Vec_IntAlloc( 100 );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( pObj->fMarkA )
            Vec_IntPush( vNodes, Aig_ObjId(pObj) );
    Aig_ManCleanMarkA( pAig );
    return vNodes;
}